

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::CampaignManager::Record
          (CampaignManager *this,string *name,size_t step,double time)

{
  value_type vVar1;
  bool bVar2;
  ostream *poVar3;
  reference pvVar4;
  reference pvVar5;
  pointer ppVar6;
  size_type sVar7;
  reference puVar8;
  ulong in_RDX;
  string *in_RSI;
  size_t in_RDI;
  double in_XMM0_Qa;
  double dVar9;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>,_bool>
  pVar10;
  CampaignRecord r_1;
  size_t old_delta_step;
  size_type nsteps;
  double delta_time;
  double last_time;
  size_t delta_step;
  size_t last_step;
  iterator r;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
  *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff20;
  CampaignRecord *in_stack_ffffffffffffff30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_true>
  local_28;
  double local_20;
  ulong local_18;
  string *local_10;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  if (0 < *(int *)(in_RDI + 4)) {
    local_10 = in_RSI;
    poVar3 = std::operator<<((ostream *)&std::cout,"Campaign Manager ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x90));
    poVar3 = std::operator<<(poVar3,"   Record name = ");
    poVar3 = std::operator<<(poVar3,local_10);
    poVar3 = std::operator<<(poVar3," step = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3," time = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
    std::operator<<(poVar3,"\n");
  }
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
       ::find(in_stack_fffffffffffffef8,(key_type *)0xdb4e5b);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
       ::end(in_stack_fffffffffffffef8);
  bVar2 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar2) {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                  *)0xdb4ea7);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    vVar1 = *pvVar4;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                  *)0xdb4ee3);
    pvVar5 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    dVar9 = local_20 - *pvVar5;
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                           *)0xdb4f28);
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      (&(ppVar6->second).steps);
    if (sVar7 == 1) {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                             *)0xdb4f61);
      (ppVar6->second).delta_step = local_18 - vVar1;
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                             *)0xdb4f86);
      (ppVar6->second).delta_time = dVar9;
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                    *)0xdb4fa3);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      in_stack_ffffffffffffff10 =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
            *)*pvVar4;
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                    *)0xdb4fc4);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::rbegin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08)
      ;
      puVar8 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                            (difference_type)in_stack_fffffffffffffef8);
      if ((long)in_stack_ffffffffffffff10 - *puVar8 != local_18 - vVar1) {
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                               *)0xdb501c);
        (ppVar6->second).delta_step = 0;
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                               *)0xdb5031);
        (ppVar6->second).delta_time = 0.0;
        ppVar6 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                               *)0xdb5046);
        (ppVar6->second).varying_deltas = true;
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                  *)0xdb5059);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10,
               (value_type *)in_stack_ffffffffffffff08);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_false,_true>
                  *)0xdb507a);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
               (value_type_conflict1 *)in_stack_ffffffffffffff08);
  }
  else {
    CampaignRecord::CampaignRecord(in_stack_ffffffffffffff30,in_RDI,in_stack_ffffffffffffff20);
    pVar10 = std::
             unordered_map<std::__cxx11::string,adios2::core::engine::CampaignRecord,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::engine::CampaignRecord>>>
             ::emplace<std::__cxx11::string_const&,adios2::core::engine::CampaignRecord&>
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        (CampaignRecord *)
                        CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    CampaignRecord::~CampaignRecord
              ((CampaignRecord *)CONCAT17(pVar10.second,in_stack_ffffffffffffff00));
  }
  return;
}

Assistant:

void CampaignManager::Record(const std::string &name, const size_t step, const double time)
{
    if (m_Options.verbose > 0)
    {
        std::cout << "Campaign Manager " << m_WriterRank << "   Record name = " << name
                  << " step = " << step << " time = " << time << "\n";
    }
    auto r = cmap.find(name);
    if (r != cmap.end())
    {
        // update record
        size_t last_step = r->second.steps.back();
        size_t delta_step = step - last_step;
        double last_time = r->second.times.back();
        double delta_time = time - last_time;
        auto nsteps = r->second.steps.size();
        if (nsteps == 1)
        {
            r->second.delta_step = delta_step;
            r->second.delta_time = delta_time;
        }
        else
        {
            size_t old_delta_step = r->second.steps.back() - r->second.steps.rbegin()[1];
            if (old_delta_step != delta_step)
            {
                r->second.delta_step = 0;
                r->second.delta_time = 0.0;
                r->second.varying_deltas = true;
            }
        }
        r->second.steps.push_back(step);
        r->second.times.push_back(time);
    }
    else
    {
        // new entry
        CampaignRecord r(step, time);
        cmap.emplace(name, r);
    }
}